

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_shape(REF_CELL_TYPE cell_type,REF_DBL *bary,REF_DBL *shape)

{
  int local_24;
  REF_INT cell_node;
  REF_DBL *shape_local;
  REF_DBL *bary_local;
  REF_CELL_TYPE cell_type_local;
  
  switch(cell_type) {
  case REF_CELL_EDG:
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      shape[local_24] = bary[local_24];
    }
  default:
switchD_00139f92_default:
    bary_local._4_4_ = 0;
    break;
  case REF_CELL_ED2:
    shape[2] = *bary * 4.0 * bary[1];
    *shape = shape[2] * -0.5 + *bary;
    shape[1] = shape[2] * -0.5 + bary[1];
    goto switchD_00139f92_default;
  case REF_CELL_ED3:
    *shape = *bary * 4.5 * (*bary - 0.3333333333333333) * (*bary - 0.6666666666666666);
    shape[1] = bary[1] * 4.5 * (bary[1] - 0.3333333333333333) * (bary[1] - 0.6666666666666666);
    shape[2] = *bary * 13.5 * bary[1] * (*bary - 0.3333333333333333);
    shape[3] = bary[1] * 13.5 * *bary * (bary[1] - 0.3333333333333333);
    goto switchD_00139f92_default;
  case REF_CELL_TRI:
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      shape[local_24] = bary[local_24];
    }
    goto switchD_00139f92_default;
  case REF_CELL_TR2:
    shape[3] = *bary * 4.0 * bary[1];
    shape[4] = bary[1] * 4.0 * bary[2];
    shape[5] = bary[2] * 4.0 * *bary;
    *shape = shape[5] * -0.5 + shape[3] * -0.5 + *bary;
    shape[1] = shape[4] * -0.5 + shape[3] * -0.5 + bary[1];
    shape[2] = shape[5] * -0.5 + shape[4] * -0.5 + bary[2];
    goto switchD_00139f92_default;
  case REF_CELL_TR3:
    *shape = *bary * 4.5 * (*bary - 0.3333333333333333) * (*bary - 0.6666666666666666);
    shape[1] = bary[1] * 4.5 * (bary[1] - 0.3333333333333333) * (bary[1] - 0.6666666666666666);
    shape[2] = bary[2] * 4.5 * (bary[2] - 0.3333333333333333) * (bary[2] - 0.6666666666666666);
    shape[3] = *bary * 13.5 * bary[1] * (*bary - 0.3333333333333333);
    shape[4] = *bary * 13.5 * bary[1] * (bary[1] - 0.3333333333333333);
    shape[5] = bary[1] * 13.5 * bary[2] * (bary[1] - 0.3333333333333333);
    shape[6] = bary[1] * 13.5 * bary[2] * (bary[2] - 0.3333333333333333);
    shape[7] = bary[2] * 13.5 * *bary * (bary[2] - 0.3333333333333333);
    shape[8] = bary[2] * 13.5 * *bary * (*bary - 0.3333333333333333);
    shape[9] = *bary * 27.0 * bary[1] * bary[2];
    goto switchD_00139f92_default;
  case REF_CELL_QUA:
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
    break;
  case REF_CELL_QU2:
    for (local_24 = 0; local_24 < 9; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
    break;
  case REF_CELL_TET:
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      shape[local_24] = bary[local_24];
    }
    goto switchD_00139f92_default;
  case REF_CELL_PYR:
    for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
    break;
  case REF_CELL_PRI:
    for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
    break;
  case REF_CELL_HEX:
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
    break;
  case REF_CELL_TE2:
    for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
    break;
  case REF_CELL_PY2:
    for (local_24 = 0; local_24 < 0xe; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
    break;
  case REF_CELL_PR2:
    for (local_24 = 0; local_24 < 0x12; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
    break;
  case REF_CELL_HE2:
    for (local_24 = 0; local_24 < 0x1b; local_24 = local_24 + 1) {
      shape[local_24] = 0.0;
    }
    bary_local._4_4_ = 6;
  }
  return bary_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_shape(REF_CELL_TYPE cell_type, REF_DBL *bary,
                                  REF_DBL *shape) {
  REF_INT cell_node;
  switch (cell_type) {
    case REF_CELL_EDG:
      for (cell_node = 0; cell_node < 2; cell_node++) {
        shape[cell_node] = bary[cell_node];
      }
      break;
    case REF_CELL_TRI:
      for (cell_node = 0; cell_node < 3; cell_node++) {
        shape[cell_node] = bary[cell_node];
      }
      break;
    case REF_CELL_TET:
      for (cell_node = 0; cell_node < 4; cell_node++) {
        shape[cell_node] = bary[cell_node];
      }
      break;
    case REF_CELL_ED2:
      shape[2] = 4.0 * bary[0] * bary[1];
      shape[0] = bary[0] - 0.5 * shape[2];
      shape[1] = bary[1] - 0.5 * shape[2];
      break;
    case REF_CELL_ED3:
      shape[0] =
          9.0 / 2.0 * bary[0] * (bary[0] - 1.0 / 3.0) * (bary[0] - 2.0 / 3.0);
      shape[1] =
          9.0 / 2.0 * bary[1] * (bary[1] - 1.0 / 3.0) * (bary[1] - 2.0 / 3.0);
      shape[2] = 27.0 / 2.0 * bary[0] * bary[1] * (bary[0] - 1.0 / 3.0);
      shape[3] = 27.0 / 2.0 * bary[1] * bary[0] * (bary[1] - 1.0 / 3.0);
      break;
    case REF_CELL_TR2:
      shape[3] = 4.0 * bary[0] * bary[1];
      shape[4] = 4.0 * bary[1] * bary[2];
      shape[5] = 4.0 * bary[2] * bary[0];
      shape[0] = bary[0] - 0.5 * shape[3] - 0.5 * shape[5];
      shape[1] = bary[1] - 0.5 * shape[3] - 0.5 * shape[4];
      shape[2] = bary[2] - 0.5 * shape[4] - 0.5 * shape[5];
      break;
    case REF_CELL_TR3:
      shape[0] =
          9.0 / 2.0 * bary[0] * (bary[0] - 1.0 / 3.0) * (bary[0] - 2.0 / 3.0);
      shape[1] =
          9.0 / 2.0 * bary[1] * (bary[1] - 1.0 / 3.0) * (bary[1] - 2.0 / 3.0);
      shape[2] =
          9.0 / 2.0 * bary[2] * (bary[2] - 1.0 / 3.0) * (bary[2] - 2.0 / 3.0);

      shape[3] = 27.0 / 2.0 * bary[0] * bary[1] * (bary[0] - 1.0 / 3.0);
      shape[4] = 27.0 / 2.0 * bary[0] * bary[1] * (bary[1] - 1.0 / 3.0);

      shape[5] = 27.0 / 2.0 * bary[1] * bary[2] * (bary[1] - 1.0 / 3.0);
      shape[6] = 27.0 / 2.0 * bary[1] * bary[2] * (bary[2] - 1.0 / 3.0);

      shape[7] = 27.0 / 2.0 * bary[2] * bary[0] * (bary[2] - 1.0 / 3.0);
      shape[8] = 27.0 / 2.0 * bary[2] * bary[0] * (bary[0] - 1.0 / 3.0);

      shape[9] = 27.0 * bary[0] * bary[1] * bary[2];
      break;
    case REF_CELL_QUA:
      for (cell_node = 0; cell_node < 4; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_QU2:
      for (cell_node = 0; cell_node < 9; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_PYR:
      for (cell_node = 0; cell_node < 5; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_PRI:
      for (cell_node = 0; cell_node < 6; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_HEX:
      for (cell_node = 0; cell_node < 8; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_TE2:
      for (cell_node = 0; cell_node < 10; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_PY2:
      for (cell_node = 0; cell_node < 14; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_PR2:
      for (cell_node = 0; cell_node < 18; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
    case REF_CELL_HE2:
      for (cell_node = 0; cell_node < 27; cell_node++) {
        shape[cell_node] = 0.0;
      }
      return REF_IMPLEMENT;
  }
  return REF_SUCCESS;
}